

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

null_terminating_iterator<char> __thiscall
fmt::v5::internal::
parse_arg_id<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::internal::width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>>&,char>>
          (internal *this,null_terminating_iterator<char> it,
          width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>_&,_char>
          *handler)

{
  basic_format_specs<char> *pbVar1;
  null_terminating_iterator<char> nVar2;
  uint arg_id;
  internal iVar3;
  internal *piVar4;
  width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>_&,_char>
  *this_00;
  basic_string_view<char> id;
  undefined1 local_49;
  null_terminating_iterator<char> local_48;
  basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  local_38;
  
  this_00 = (width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>_&,_char>
             *)it.end_;
  local_48.end_ = it.ptr_;
  if (this == (internal *)local_48.end_) {
    iVar3 = (internal)0x0;
  }
  else {
    iVar3 = *this;
  }
  local_48.ptr_ = (char *)this;
  if ((iVar3 == (internal)0x7d) || (iVar3 == (internal)0x3a)) {
    width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>_&,_char>
    ::operator()(this_00);
  }
  else {
    if ((byte)((char)iVar3 - 0x30U) < 10) {
      arg_id = parse_nonnegative_int<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::internal::width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>>&,char>&>
                         (&local_48,this_00);
      if ((local_48.ptr_ != local_48.end_) &&
         (((internal)*local_48.ptr_ == (internal)0x7d ||
          ((local_48.ptr_ != local_48.end_ && ((internal)*local_48.ptr_ == (internal)0x3a)))))) {
        pbVar1 = (this_00->handler->
                 super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                 ).super_specs_setter<char>.specs_;
        specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        ::get_arg<unsigned_int>
                  (&local_38,
                   &this_00->handler->
                    super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                   ,arg_id);
        set_dynamic_spec<fmt::v5::internal::width_checker,unsigned_int,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,fmt::v5::internal::error_handler>
                  (pbVar1,&local_49);
        goto LAB_0012ed05;
      }
    }
    else if ((iVar3 == (internal)0x5f) || ((byte)(((byte)iVar3 & 0xdf) + 0xbf) < 0x1a)) {
      id.size_ = 0;
      piVar4 = this + 1;
      do {
        local_48.ptr_ = (char *)piVar4;
        if (local_48.ptr_ == local_48.end_) {
          iVar3 = (internal)0x0;
        }
        else {
          iVar3 = (internal)*local_48.ptr_;
        }
        id.size_ = id.size_ + 1;
        piVar4 = (internal *)local_48.ptr_ + 1;
      } while ((((byte)((char)iVar3 - 0x30U) < 10) || (iVar3 == (internal)0x5f)) ||
              ((byte)(((byte)iVar3 & 0xdf) + 0xbf) < 0x1a));
      if ((long)id.size_ < 0) {
        __assert_fail("(value >= 0) && \"negative value\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/lib/logging/spdlog/fmt/bundled/core.h"
                      ,0xde,
                      "typename std::make_unsigned<Int>::type fmt::internal::to_unsigned(Int) [Int = long]"
                     );
      }
      id.data_ = (char *)this;
      width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>_&,_char>
      ::operator()(this_00,id);
      goto LAB_0012ed05;
    }
    basic_parse_context<char,_fmt::v5::internal::error_handler>::on_error
              ((basic_parse_context<char,_fmt::v5::internal::error_handler> *)
               (this_00->handler->
               super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
               ).context_,"invalid format string");
  }
LAB_0012ed05:
  nVar2.end_ = local_48.end_;
  nVar2.ptr_ = local_48.ptr_;
  return nVar2;
}

Assistant:

FMT_CONSTEXPR Iterator parse_arg_id(Iterator it, IDHandler &&handler) {
  typedef typename std::iterator_traits<Iterator>::value_type char_type;
  char_type c = *it;
  if (c == '}' || c == ':') {
    handler();
    return it;
  }
  if (c >= '0' && c <= '9') {
    unsigned index = parse_nonnegative_int(it, handler);
    if (*it != '}' && *it != ':') {
      handler.on_error("invalid format string");
      return it;
    }
    handler(index);
    return it;
  }
  if (!is_name_start(c)) {
    handler.on_error("invalid format string");
    return it;
  }
  auto start = it;
  do {
    c = *++it;
  } while (is_name_start(c) || ('0' <= c && c <= '9'));
  handler(basic_string_view<char_type>(
            pointer_from(start), to_unsigned(it - start)));
  return it;
}